

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxOut
          (ConfidentialTransaction *this,Amount *value,ConfidentialAssetId *asset,
          Script *locking_script,ConfidentialNonce *nonce,ByteData *surjection_proof,
          ByteData *range_proof)

{
  pointer pCVar1;
  pointer pCVar2;
  Amount *value_00;
  CfdException *pCVar3;
  pointer rangeproof;
  pointer nonce_00;
  pointer surjectionproof;
  uchar *puVar4;
  unsigned_long local_218;
  int ret;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1f0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1d8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1c0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_190;
  Script *local_178;
  ConfidentialAssetId *local_170;
  ConfidentialNonce *local_168;
  ByteData *local_160;
  Amount *local_158;
  ConfidentialValue confidential_value;
  ConfidentialTxOut out;
  
  if ((long)(this->vout_).
            super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->vout_).
            super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
            ._M_impl.super__Vector_impl_data._M_start == 0xf7ffffff08) {
    out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4f4893;
    out.super_AbstractTxOut.value_.amount_._0_4_ = 0x88f;
    out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_385708;
    logger::warn<>((CfdSourceLocation *)&out,"vout maximum.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&out,"vout maximum.",(allocator *)&confidential_value);
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&out);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ConfidentialValue::ConfidentialValue(&confidential_value,value);
  Script::GetData((ByteData *)&out,locking_script);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_190,
                     (ByteData *)&out);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&out);
  ConfidentialAssetId::GetData((ByteData *)&out,asset);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1a8,
                     (ByteData *)&out);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&out);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out,
             &confidential_value.data_.data_);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c0,
                     (ByteData *)&out);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&out);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&out,&(nonce->data_).data_);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1d8,
                     (ByteData *)&out);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&out);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1f0,
                     surjection_proof);
  local_178 = locking_script;
  local_170 = asset;
  local_168 = nonce;
  local_160 = surjection_proof;
  local_158 = value;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208,range_proof
                    );
  puVar4 = (uchar *)0x0;
  nonce_00 = local_1d8._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_1d8._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1d8._M_impl.super__Vector_impl_data._M_start == 0) {
    nonce_00 = puVar4;
  }
  surjectionproof = local_1f0._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_1f0._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1f0._M_impl.super__Vector_impl_data._M_start == 0) {
    surjectionproof = puVar4;
  }
  rangeproof = local_208._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_208._M_impl.super__Vector_impl_data._M_finish -
      (long)local_208._M_impl.super__Vector_impl_data._M_start == 0) {
    rangeproof = puVar4;
  }
  ret = wally_tx_add_elements_raw_output
                  ((wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_,
                   local_190._M_impl.super__Vector_impl_data._M_start,
                   (long)local_190._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_190._M_impl.super__Vector_impl_data._M_start,
                   local_1a8._M_impl.super__Vector_impl_data._M_start,
                   (long)local_1a8._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1a8._M_impl.super__Vector_impl_data._M_start,
                   local_1c0._M_impl.super__Vector_impl_data._M_start,
                   (long)local_1c0._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1c0._M_impl.super__Vector_impl_data._M_start,nonce_00,
                   (long)local_1d8._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1d8._M_impl.super__Vector_impl_data._M_start,surjectionproof,
                   (long)local_1f0._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1f0._M_impl.super__Vector_impl_data._M_start,rangeproof,
                   (long)local_208._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_208._M_impl.super__Vector_impl_data._M_start,0);
  value_00 = local_158;
  if (ret == 0) {
    ConfidentialTxOut::ConfidentialTxOut
              (&out,local_178,local_170,&confidential_value,local_168,local_160,range_proof);
    ConfidentialTxOut::SetValue(&out,value_00);
    ::std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
    push_back(&this->vout_,&out);
    pCVar1 = (this->vout_).
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pCVar2 = (this->vout_).
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ConfidentialTxOut::~ConfidentialTxOut(&out);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_208);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1f0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1d8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1c0);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1a8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_190);
    ConfidentialValue::~ConfidentialValue(&confidential_value);
    return (int)(((long)pCVar1 - (long)pCVar2) / 0xf8) - 1;
  }
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4f4893;
  out.super_AbstractTxOut.value_.amount_._0_4_ = 0x8a8;
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_385708;
  logger::warn<int&>((CfdSourceLocation *)&out,"wally_tx_add_elements_raw_output NG[{}].",&ret);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4f4893;
  out.super_AbstractTxOut.value_.amount_._0_4_ = 0x8a9;
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_385708;
  local_218 = (long)local_190._M_impl.super__Vector_impl_data._M_finish -
              (long)local_190._M_impl.super__Vector_impl_data._M_start;
  logger::warn<unsigned_long>((CfdSourceLocation *)&out,"script_data.size[{}].",&local_218);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4f4893;
  out.super_AbstractTxOut.value_.amount_._0_4_ = 0x8aa;
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_385708;
  local_218 = (long)local_1a8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1a8._M_impl.super__Vector_impl_data._M_start;
  logger::warn<unsigned_long>((CfdSourceLocation *)&out,"asset_data.size[{}].",&local_218);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4f4893;
  out.super_AbstractTxOut.value_.amount_._0_4_ = 0x8ab;
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_385708;
  local_218 = (long)local_1c0._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1c0._M_impl.super__Vector_impl_data._M_start;
  logger::warn<unsigned_long>((CfdSourceLocation *)&out,"value_data.size[{}].",&local_218);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4f4893;
  out.super_AbstractTxOut.value_.amount_._0_4_ = 0x8ac;
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_385708;
  local_218 = (long)local_1d8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1d8._M_impl.super__Vector_impl_data._M_start;
  logger::warn<unsigned_long>((CfdSourceLocation *)&out,"nonce_data.size[{}].",&local_218);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4f4893;
  out.super_AbstractTxOut.value_.amount_._0_4_ = 0x8ad;
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_385708;
  local_218 = (long)local_1f0._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1f0._M_impl.super__Vector_impl_data._M_start;
  logger::warn<unsigned_long>((CfdSourceLocation *)&out,"surjection_data.size[{}].",&local_218);
  out.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)0x4f4893;
  out.super_AbstractTxOut.value_.amount_._0_4_ = 0x8ae;
  out.super_AbstractTxOut.value_._8_8_ = anon_var_dwarf_385708;
  local_218 = (long)local_208._M_impl.super__Vector_impl_data._M_finish -
              (long)local_208._M_impl.super__Vector_impl_data._M_start;
  logger::warn<unsigned_long>((CfdSourceLocation *)&out,"range_data.size[{}].",&local_218);
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&out,"vout add error.",(allocator *)&local_218);
  CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&out);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

uint32_t ConfidentialTransaction::AddTxOut(
    const Amount &value, const ConfidentialAssetId &asset,
    const Script &locking_script, const ConfidentialNonce &nonce,
    const ByteData &surjection_proof, const ByteData &range_proof) {
  if (vout_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vout maximum.");
    throw CfdException(kCfdIllegalStateError, "vout maximum.");
  }

  ConfidentialValue confidential_value = ConfidentialValue(value);
  const std::vector<uint8_t> &script_data =
      locking_script.GetData().GetBytes();
  const std::vector<uint8_t> &asset_data = asset.GetData().GetBytes();
  const std::vector<uint8_t> &value_data =
      confidential_value.GetData().GetBytes();
  const std::vector<uint8_t> &nonce_data = nonce.GetData().GetBytes();
  const std::vector<uint8_t> &surjection_data = surjection_proof.GetBytes();
  const std::vector<uint8_t> &range_data = range_proof.GetBytes();

  int ret = wally_tx_add_elements_raw_output(
      static_cast<struct wally_tx *>(wally_tx_pointer_), script_data.data(),
      script_data.size(), asset_data.data(), asset_data.size(),
      value_data.data(), value_data.size(),
      (nonce_data.size() == 0) ? nullptr : nonce_data.data(),
      nonce_data.size(),
      (surjection_data.size() == 0) ? nullptr : surjection_data.data(),
      surjection_data.size(),
      (range_data.size() == 0) ? nullptr : range_data.data(),
      range_data.size(), 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_elements_raw_output NG[{}].", ret);
    warn(CFD_LOG_SOURCE, "script_data.size[{}].", script_data.size());
    warn(CFD_LOG_SOURCE, "asset_data.size[{}].", asset_data.size());
    warn(CFD_LOG_SOURCE, "value_data.size[{}].", value_data.size());
    warn(CFD_LOG_SOURCE, "nonce_data.size[{}].", nonce_data.size());
    warn(CFD_LOG_SOURCE, "surjection_data.size[{}].", surjection_data.size());
    warn(CFD_LOG_SOURCE, "range_data.size[{}].", range_data.size());
    throw CfdException(kCfdIllegalStateError, "vout add error.");
  }

  ConfidentialTxOut out(
      locking_script, asset, confidential_value, nonce, surjection_proof,
      range_proof);
  out.SetValue(value);
  vout_.push_back(out);
  return static_cast<uint32_t>(vout_.size() - 1);
}